

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<unsigned_long,false,false>
          (unsigned_long *values,idx_t count)

{
  bitpacking_width_t bVar1;
  ulong max_value;
  idx_t i;
  ulong uVar2;
  
  max_value = *values;
  for (uVar2 = 1; uVar2 < count; uVar2 = uVar2 + 1) {
    if (max_value < values[uVar2]) {
      max_value = values[uVar2];
    }
  }
  bVar1 = FindMinimumBitWidth<unsigned_long,false,false>(*values,max_value);
  return bVar1;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T *values, idx_t count) {
		T min_value = values[0];
		T max_value = values[0];

		for (idx_t i = 1; i < count; i++) {
			if (values[i] > max_value) {
				max_value = values[i];
			}

			if (is_signed) {
				if (values[i] < min_value) {
					min_value = values[i];
				}
			}
		}

		return FindMinimumBitWidth<T, is_signed, round_to_next_byte>(min_value, max_value);
	}